

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

cio_error set_termios(int fd,termios *tty)

{
  int iVar1;
  int *piVar2;
  int ret;
  termios *tty_local;
  int fd_local;
  
  iVar1 = tcflush(fd,0);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    tty_local._4_4_ = -*piVar2;
  }
  else {
    iVar1 = tcsetattr(fd,0,(termios *)tty);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      tty_local._4_4_ = -*piVar2;
    }
    else {
      tty_local._4_4_ = CIO_SUCCESS;
    }
  }
  return tty_local._4_4_;
}

Assistant:

static enum cio_error set_termios(int fd, struct termios *tty)
{
	int ret = tcflush(fd, TCIFLUSH);
	if (cio_unlikely(ret == -1)) {
		return (enum cio_error)(-errno);
	}
	ret = tcsetattr(fd, TCSANOW, tty);
	if (cio_unlikely(ret == -1)) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}